

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.hpp
# Opt level: O1

void __thiscall
duckdb::MiniZStream::Compress
          (MiniZStream *this,char *uncompressed_data,size_t uncompressed_size,char *out_data,
          size_t *out_size)

{
  mz_ulong mVar1;
  int mz_ret;
  uint mz_ret_00;
  mz_ulong mVar2;
  
  mz_ret = duckdb_miniz::mz_deflateInit2(&this->stream,6,8,-0xf,1,0);
  if (mz_ret != 0) {
    FormatException(this,"Failed to initialize miniz",mz_ret);
  }
  this->type = MINIZ_TYPE_DEFLATE;
  out_data[8] = '\0';
  out_data[9] = '\0';
  out_data[0] = '\0';
  out_data[1] = '\0';
  out_data[2] = '\0';
  out_data[3] = '\0';
  out_data[4] = '\0';
  out_data[5] = '\0';
  out_data[6] = '\0';
  out_data[7] = '\0';
  out_data[0] = '\x1f';
  out_data[1] = -0x75;
  out_data[2] = '\b';
  out_data[7] = '\0';
  out_data[8] = '\0';
  out_data[3] = '\0';
  out_data[4] = '\0';
  out_data[5] = '\0';
  out_data[6] = '\0';
  out_data[9] = -1;
  (this->stream).next_in = (uchar *)uncompressed_data;
  (this->stream).avail_in = (uint)uncompressed_size;
  (this->stream).next_out = (uchar *)(out_data + 10);
  (this->stream).avail_out = (int)*out_size - 10;
  mz_ret_00 = duckdb_miniz::mz_deflate(&this->stream,4);
  if (1 < mz_ret_00) {
    FormatException(this,"Failed to compress GZIP block",mz_ret_00);
  }
  mVar1 = (this->stream).total_out;
  mVar2 = duckdb_miniz::mz_crc32(0,(mz_uint8 *)uncompressed_data,uncompressed_size);
  (out_data + 10)[mVar1] = (uchar)mVar2;
  out_data[mVar1 + 0xb] = (char)(mVar2 >> 8);
  out_data[mVar1 + 0xc] = (char)(mVar2 >> 0x10);
  out_data[mVar1 + 0xd] = (char)(mVar2 >> 0x18);
  out_data[mVar1 + 0xe] = (char)uncompressed_size;
  out_data[mVar1 + 0xf] = (char)(uncompressed_size >> 8);
  out_data[mVar1 + 0x10] = (char)(uncompressed_size >> 0x10);
  out_data[mVar1 + 0x11] = (char)(uncompressed_size >> 0x18);
  *out_size = (this->stream).total_out + 0x12;
  return;
}

Assistant:

void Compress(const char *uncompressed_data, size_t uncompressed_size, char *out_data, size_t *out_size) {
		auto mz_ret = mz_deflateInit2(&stream, duckdb_miniz::MZ_DEFAULT_LEVEL, MZ_DEFLATED, -MZ_DEFAULT_WINDOW_BITS, 1, 0);
		if (mz_ret != duckdb_miniz::MZ_OK) {
			FormatException("Failed to initialize miniz", mz_ret);
		}
		type = MiniZStreamType::MINIZ_TYPE_DEFLATE;

		auto gzip_header = (unsigned char*) out_data;
		InitializeGZIPHeader(gzip_header);

		auto gzip_body = gzip_header + GZIP_HEADER_MINSIZE;

		stream.next_in = (const unsigned char*) uncompressed_data;
		stream.avail_in =  static_cast<unsigned int >(uncompressed_size);
		stream.next_out = gzip_body;
		stream.avail_out =  static_cast<unsigned int >(*out_size - GZIP_HEADER_MINSIZE);

		mz_ret = mz_deflate(&stream, duckdb_miniz::MZ_FINISH);
		if (mz_ret != duckdb_miniz::MZ_OK && mz_ret != duckdb_miniz::MZ_STREAM_END) {
			FormatException("Failed to compress GZIP block", mz_ret);
		}
		auto gzip_footer = gzip_body + stream.total_out;
		auto crc = duckdb_miniz::mz_crc32(MZ_CRC32_INIT, (const unsigned char*) uncompressed_data, uncompressed_size);
		InitializeGZIPFooter(gzip_footer, crc, uncompressed_size);

		*out_size = stream.total_out + GZIP_HEADER_MINSIZE + GZIP_FOOTER_SIZE;
	}